

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaPCustomAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlChar **ownerDes,
               xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,char *msg)

{
  xmlChar *unaff_RBX;
  char *strData3;
  xmlChar *unaff_R12;
  xmlChar *in_stack_ffffffffffffffc8;
  xmlChar *des;
  
  des = (xmlChar *)0x0;
  xmlSchemaFormatItemForReport
            (&des,(xmlChar *)0x0,(xmlSchemaBasicItemPtr)ownerDes[5],(xmlNodePtr)ownerItem);
  if (ownerDes == (xmlChar **)0x0) {
    strData3 = "Unknown";
    ownerDes = (xmlChar **)0x0;
  }
  else {
    strData3 = (char *)ownerDes[2];
  }
  xmlSchemaPErrExt(ctxt,(xmlNodePtr)ownerDes,error,(xmlChar *)"%s, attribute \'%s\': %s.\n",des,
                   (xmlChar *)strData3,(char *)ownerItem,(xmlChar *)0x0,in_stack_ffffffffffffffc8,
                   des,unaff_RBX,unaff_R12);
  if (des != (xmlChar *)0x0) {
    (*xmlFree)(des);
  }
  return;
}

Assistant:

static void
xmlSchemaPCustomAttrErr(xmlSchemaParserCtxtPtr ctxt,
			xmlParserErrors error,
			xmlChar **ownerDes,
			xmlSchemaBasicItemPtr ownerItem,
			xmlAttrPtr attr,
			const char *msg)
{
    xmlChar *des = NULL;

    if (ownerDes == NULL)
	xmlSchemaFormatItemForReport(&des, NULL, ownerItem, attr->parent);
    else if (*ownerDes == NULL) {
	xmlSchemaFormatItemForReport(ownerDes, NULL, ownerItem, attr->parent);
	des = *ownerDes;
    } else
	des = *ownerDes;
    if (attr == NULL) {
	xmlSchemaPErrExt(ctxt, NULL, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, (const xmlChar *) "Unknown",
	    (const xmlChar *) msg, NULL, NULL);
    } else {
	xmlSchemaPErrExt(ctxt, (xmlNodePtr) attr, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, attr->name, (const xmlChar *) msg, NULL, NULL);
    }
    if (ownerDes == NULL)
	FREE_AND_NULL(des);
}